

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_parser.hpp
# Opt level: O1

void __thiscall
jsoncons::bson::
basic_bson_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
::read_cstring(basic_bson_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
               *this,string_type *buffer,error_code *ec)

{
  size_t *psVar1;
  uint8_t *puVar2;
  long lVar3;
  uint8_t c;
  uint8_t local_29;
  uint8_t *puVar4;
  
  local_29 = 0xff;
  while( true ) {
    puVar2 = (this->source_).current_.p_;
    puVar4 = &local_29;
    if (puVar2 != (this->source_).end_.p_) {
      local_29 = *puVar2;
      (this->source_).current_.p_ = puVar2 + 1;
      puVar4 = &stack0xffffffffffffffd8;
    }
    lVar3 = (long)puVar4 - (long)&local_29;
    psVar1 = &(this->source_).position_;
    *psVar1 = *psVar1 + lVar3;
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + lVar3;
    if (lVar3 != 1) break;
    if (local_29 == '\0') {
      return;
    }
    std::__cxx11::string::push_back((char)buffer);
  }
  std::error_code::operator=(ec,unexpected_eof);
  this->more_ = false;
  return;
}

Assistant:

void read_cstring(string_type& buffer, std::error_code& ec)
    {
        uint8_t c = 0xff;
        while (true)
        {
            std::size_t n = source_.read(&c, 1);
            state_stack_.back().pos += n;
            if (JSONCONS_UNLIKELY(n != 1))
            {
                ec = bson_errc::unexpected_eof;
                more_ = false;
                return;
            }
            if (c == 0)
            {
                break;
            }
            buffer.push_back(c);
        }
    }